

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t archive_read_format_tar_read_header(archive_read *a,archive_entry *entry)

{
  byte bVar1;
  char cVar2;
  tar *tar;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  mode_t mVar9;
  wchar_t wVar10;
  archive_read *a_00;
  char *pcVar11;
  int64_t iVar12;
  gnu_sparse *sparse;
  ulong uVar13;
  dev_t dVar14;
  archive_string_conv *paVar15;
  archive_acl *acl;
  int *piVar16;
  wchar_t *pwVar17;
  size_t sVar18;
  ssize_t sVar19;
  wchar_t *pwVar20;
  char *pcVar22;
  size_t n;
  sparse_block *sb;
  sparse_block *psVar24;
  int iVar25;
  long lVar26;
  void *pvVar27;
  archive_read *paVar28;
  undefined8 uVar29;
  uint uVar30;
  size_t *in_R8;
  bool bVar31;
  uint local_84;
  size_t local_70;
  char *local_68;
  size_t sStack_60;
  size_t local_58;
  int local_44;
  size_t local_40;
  archive_string *local_38;
  wchar_t *pwVar21;
  char *pcVar23;
  
  local_70 = 0;
  archive_entry_set_dev(entry,(long)archive_read_format_tar_read_header::default_dev + 1);
  lVar26 = (long)archive_read_format_tar_read_header::default_inode;
  archive_read_format_tar_read_header::default_inode = (wchar_t)(lVar26 + 1);
  archive_entry_set_ino(entry,lVar26 + 1);
  if (L'\xfffe' < archive_read_format_tar_read_header::default_inode) {
    archive_read_format_tar_read_header::default_dev =
         archive_read_format_tar_read_header::default_dev + L'\x01';
    archive_read_format_tar_read_header::default_inode = L'\0';
  }
  tar = (tar *)a->format->data;
  tar->entry_offset = 0;
  while (psVar24 = tar->sparse_list, psVar24 != (sparse_block *)0x0) {
    tar->sparse_list = psVar24->next;
    free(psVar24);
  }
  tar->sparse_last = (sparse_block *)0x0;
  tar->size_fields = '\0';
  tar->sconv = tar->opt_sconv;
  if (tar->opt_sconv == (archive_string_conv *)0x0) {
    if (tar->init_default_conversion == 0) {
      paVar15 = archive_string_default_conversion_for_read(&a->archive);
      tar->sconv_default = paVar15;
      tar->init_default_conversion = 1;
    }
    else {
      paVar15 = tar->sconv_default;
    }
    tar->sconv = paVar15;
  }
  tar->pax_hdrcharset_utf8 = 1;
  tar->sparse_gnu_attributes_seen = '\0';
  (tar->entry_gname).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  (tar->entry_uname).length = 0;
  (tar->entry_linkpath).length = 0;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format = 0x30000;
    (a->archive).archive_format_name = "tar";
  }
  local_38 = &tar->localname;
  local_44 = 0;
  wVar10 = L'\0';
  local_84 = 0;
  bVar4 = false;
  bVar3 = false;
  uVar13 = 0;
LAB_00135737:
  if (uVar13 != 0) {
    __archive_read_consume(a,uVar13);
  }
  pvVar27 = (void *)0x200;
  a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)&stack0xffffffffffffffc0);
  if (local_40 != 0) {
    if (a_00 != (archive_read *)0x0) goto code_r0x0013576c;
    pcVar11 = "Truncated tar archive detected while reading next header";
    iVar25 = 0x54;
    goto LAB_0013653a;
  }
  if (local_44 == 0) {
    wVar6 = L'\x01';
  }
  else {
    archive_set_error(&a->archive,0x16,
                      "Damaged tar archive (end-of-archive within a sequence of headers)");
    wVar6 = L'\xffffffe2';
  }
  goto LAB_00136688;
code_r0x0013576c:
  if ((char)(a_00->archive).magic == '\0') {
    lVar26 = 1;
    do {
      if ((int)lVar26 == 0x200) {
        uVar13 = 0x200;
        if (tar->read_concatenated_archives != 0) goto LAB_00135737;
        __archive_read_consume(a,0x200);
        local_70 = 0;
        pcVar11 = (char *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
        if ((pcVar11 == (char *)0x0) || (*pcVar11 != '\0')) goto LAB_0013663e;
        lVar26 = 1;
        goto LAB_001365c3;
      }
      pcVar11 = (char *)((long)&(a_00->archive).magic + lVar26);
      lVar26 = lVar26 + 1;
    } while (*pcVar11 == '\0');
  }
  local_70 = 0x200;
  wVar6 = checksum(a_00,pvVar27);
  if (wVar6 == L'\0') {
    __archive_read_consume(a,0x200);
    archive_set_error(&a->archive,0x16,"Damaged tar archive (bad header checksum)");
    wVar6 = L'\xffffffe2';
    if (local_44 == 0) {
      wVar6 = L'\xfffffff6';
    }
    goto LAB_00136688;
  }
  bVar1 = a_00->field_0x9c;
  if (bVar1 < 0x56) {
    if (bVar1 == 0x41) {
      if ((local_84 & 1) != 0) goto LAB_0013666c;
      (a->archive).archive_format = 0x30002;
      (a->archive).archive_format_name = "Solaris tar";
      iVar12 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
      local_68 = (char *)0x0;
      sStack_60 = 0;
      local_58 = 0;
      paVar28 = a;
      wVar6 = read_body_to_string(a,(tar *)&stack0xffffffffffffff98,(archive_string *)a_00,&local_70
                                  ,in_R8);
      if (wVar6 == L'\0') {
        uVar29 = CONCAT71((int7)((ulong)paVar28 >> 8),*local_68);
        if (iVar12 < 1 || *local_68 == '\0') {
          uVar13 = 0;
LAB_00135ddf:
          archive_set_error(&a->archive,-1,"Malformed Solaris ACL attribute (unsupported type %lo)",
                            uVar13);
        }
        else {
          lVar26 = -1;
          uVar13 = 0;
          pcVar11 = local_68 + 1;
          do {
            uVar30 = (int)uVar29 - 0x38;
            in_R8 = (size_t *)(ulong)uVar30;
            if ((byte)uVar30 < 0xf8) {
              pcVar11 = "Malformed Solaris ACL attribute (invalid digit)";
              goto LAB_0013643c;
            }
            in_R8 = (size_t *)(uVar13 << 3);
            if ((size_t *)0xffffff < in_R8) {
              pcVar11 = "Malformed Solaris ACL attribute (count too large)";
              goto LAB_0013643c;
            }
            uVar13 = (ulong)(byte)((char)uVar29 - 0x30) | (ulong)in_R8;
            uVar29 = CONCAT71((int7)((ulong)uVar29 >> 8),*pcVar11);
            pcVar23 = pcVar11 + 1;
            lVar26 = lVar26 + -1;
          } while ((*pcVar11 != '\0') &&
                  (bVar31 = pcVar11 < local_68 + iVar12, pcVar11 = pcVar23, bVar31));
          uVar30 = (uint)in_R8 & 0xfc0000;
          in_R8 = (size_t *)(ulong)uVar30;
          if (in_R8 == (size_t *)0x40000) {
            wVar6 = L'Ā';
          }
          else {
            if (uVar30 != 0xc0000) goto LAB_00135ddf;
            wVar6 = L'㰀';
          }
          if (pcVar23 < local_68 + iVar12) {
            sVar5 = 0;
            do {
              n = sVar5;
              if (pcVar23[n] == '\0') break;
              sVar5 = n + 1;
            } while (pcVar23 + n < pcVar23 + iVar12 + lVar26);
            if (tar->sconv_acl == (archive_string_conv *)0x0) {
              paVar15 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
              tar->sconv_acl = paVar15;
              if (paVar15 == (archive_string_conv *)0x0) {
                wVar6 = L'\xffffffe2';
                goto LAB_0013644d;
              }
            }
            (tar->localname).length = 0;
            archive_strncat(local_38,pcVar23,n);
            acl = archive_entry_acl(entry);
            wVar6 = archive_acl_from_text_l(acl,(tar->localname).s,wVar6,tar->sconv_acl);
            mVar9 = archive_entry_perm(entry);
            archive_entry_set_perm(entry,mVar9);
            if (wVar6 == L'\0') {
              wVar6 = L'\0';
            }
            else {
              piVar16 = __errno_location();
              if (*piVar16 == 0xc) {
                iVar25 = 0xc;
                pcVar11 = "Can\'t allocate memory for ACL";
              }
              else {
                iVar25 = -1;
                pcVar11 = "Malformed Solaris ACL attribute (unparsable)";
              }
              archive_set_error(&a->archive,iVar25,pcVar11);
            }
            goto LAB_0013644d;
          }
          pcVar11 = "Malformed Solaris ACL attribute (body overflow)";
LAB_0013643c:
          archive_set_error(&a->archive,-1,pcVar11);
        }
        wVar6 = L'\xffffffec';
      }
LAB_0013644d:
      local_84 = local_84 | 1;
      archive_string_free((archive_string *)&stack0xffffffffffffff98);
    }
    else if (bVar1 == 0x4b) {
      if ((local_84 & 4) != 0) goto LAB_0013666c;
      local_68 = (char *)0x0;
      sStack_60 = 0;
      local_58 = 0;
      wVar6 = read_body_to_string(a,(tar *)&stack0xffffffffffffff98,(archive_string *)a_00,&local_70
                                  ,in_R8);
      if (wVar6 == L'\0') {
        archive_entry_set_link(entry,local_68);
      }
      local_84 = local_84 | 4;
      archive_string_free((archive_string *)&stack0xffffffffffffff98);
    }
    else {
      if (bVar1 != 0x4c) goto LAB_00135a0a;
      if ((local_84 & 8) != 0) goto LAB_0013666c;
      local_68 = (char *)0x0;
      sStack_60 = 0;
      local_58 = 0;
      wVar6 = read_body_to_string(a,(tar *)&stack0xffffffffffffff98,(archive_string *)a_00,&local_70
                                  ,in_R8);
      if (wVar6 == L'\0') {
        wVar6 = _archive_entry_copy_pathname_l(entry,local_68,sStack_60,tar->sconv);
        if (wVar6 == L'\0') {
          wVar6 = L'\0';
        }
        else {
          wVar6 = set_conversion_failed_error(a,tar->sconv,"Pathname");
        }
      }
      local_84 = local_84 | 8;
      archive_string_free((archive_string *)&stack0xffffffffffffff98);
    }
  }
  else if (bVar1 < 0x67) {
    if (bVar1 == 0x56) {
      if (bVar3) goto LAB_0013666c;
      bVar3 = true;
      lVar26 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
      wVar6 = L'\xffffffe2';
      if (lVar26 < 0x100001) goto LAB_00135b5b;
    }
    else {
      if (bVar1 == 0x58) {
        if ((local_84 & 0x20) != 0) goto LAB_0013666c;
        (a->archive).archive_format = 0x30002;
        pcVar11 = "POSIX pax interchange format (Sun variant)";
        goto LAB_001358df;
      }
LAB_00135a0a:
      if (*(long *)((long)&a_00->bidders[0].name + 1) == 0x20207261747375) {
        (a->archive).archive_format = 0x30004;
        (a->archive).archive_format_name = "GNU tar format";
        pcVar11 = archive_entry_pathname(entry);
        if ((((((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) &&
              (wVar6 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
              wVar6 != L'\0')) &&
             (wVar6 = set_conversion_failed_error(a,tar->sconv,"Pathname"), wVar6 == L'\xffffffe2'))
            || (((pcVar11 = archive_entry_uname(entry), pcVar11 == (char *)0x0 || (*pcVar11 == '\0')
                 ) && ((wVar6 = _archive_entry_copy_uname_l
                                          (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,
                                           tar->sconv), wVar6 != L'\0' &&
                       (wVar6 = set_conversion_failed_error(a,tar->sconv,"Uname"),
                       wVar6 == L'\xffffffe2')))))) ||
           (((pcVar11 = archive_entry_gname(entry), pcVar11 == (char *)0x0 || (*pcVar11 == '\0')) &&
            ((wVar6 = _archive_entry_copy_gname_l
                                (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,tar->sconv),
             wVar6 != L'\0' &&
             (wVar6 = set_conversion_failed_error(a,tar->sconv,"Gname"), wVar6 == L'\xffffffe2')))))
           ) {
LAB_00135ce4:
          wVar6 = L'\xffffffe2';
          goto LAB_001360bc;
        }
        if ((byte)(a_00->field_0x9c - 0x33) < 2) {
          wVar6 = archive_entry_rdev_is_set(entry);
          if (wVar6 == L'\0') {
            dVar14 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
            archive_entry_set_rdevmajor(entry,dVar14);
            dVar14 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
            archive_entry_set_rdevminor(entry,dVar14);
          }
        }
        else {
          archive_entry_set_rdev(entry,0);
        }
        wVar6 = archive_entry_atime_is_set(entry);
        if ((wVar6 == L'\0') &&
           (iVar12 = tar_atol((char *)((long)&a_00->bidders[4].data + 1),0xc), 0 < iVar12)) {
          archive_entry_set_atime(entry,iVar12,0);
        }
        wVar6 = archive_entry_ctime_is_set(entry);
        if ((wVar6 == L'\0') &&
           (iVar12 = tar_atol((char *)((long)&a_00->bidders[4].name + 5),0xc), 0 < iVar12)) {
          archive_entry_set_ctime(entry,iVar12,0);
        }
        if (*(char *)((long)&a_00->bidders[9].vtable + 3) != '\0') {
          iVar12 = tar_atol((char *)((long)&a_00->bidders[9].vtable + 3),0xc);
          tar->GNU_sparse_realsize = iVar12;
          tar->size_fields = tar->size_fields | 2;
        }
        if (*(char *)((long)&a_00->bidders[5].vtable + 2) == '\0') {
LAB_00136047:
          wVar7 = header_common(a,tar,entry,a_00);
          wVar6 = L'\xffffffe2';
          if (wVar7 != L'\xffffffe2') {
            tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
            wVar6 = wVar7;
          }
          goto LAB_001360bc;
        }
        wVar6 = gnu_sparse_old_parse
                          (a,tar,(gnu_sparse *)((long)&a_00->bidders[5].vtable + 2),L'\x04');
        lVar26 = 0x200;
        if (wVar6 == L'\0') {
          if (*(char *)((long)&a_00->bidders[9].vtable + 2) != '\0') {
            do {
              __archive_read_consume(a,0x200);
              sparse = (gnu_sparse *)
                       __archive_read_ahead(a,0x200,(ssize_t *)&stack0xffffffffffffff98);
              if (sparse == (gnu_sparse *)0x0) {
                local_70 = 0;
                archive_set_error(&a->archive,0x54,
                                  "Truncated tar archive detected while reading sparse file data");
                lVar26 = 0;
                goto LAB_00135edf;
              }
              wVar6 = gnu_sparse_old_parse(a,tar,sparse,L'\x15');
              if (wVar6 != L'\0') {
                local_70 = 0x200;
                goto LAB_00135edf;
              }
            } while (sparse[0x15].offset[0] != '\0');
            local_70 = 0x200;
            if (tar->sparse_list != (sparse_block *)0x0) {
              tar->entry_offset = tar->sparse_list->offset;
            }
          }
          goto LAB_00136047;
        }
LAB_00135edf:
        wVar6 = L'\xffffffe2';
      }
      else {
        if (*(char *)((long)&a_00->bidders[0].name + 5) == 'r' &&
            *(int *)((long)&a_00->bidders[0].name + 1) == 0x61747375) {
          if ((a->archive).archive_format != 0x30002) {
            (a->archive).archive_format = 0x30001;
            (a->archive).archive_format_name = "POSIX ustar format";
          }
          pcVar11 = archive_entry_pathname(entry);
          pwVar17 = archive_entry_pathname_w(entry);
          if (((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) &&
             ((pwVar17 == (wchar_t *)0x0 || (*pwVar17 == L'\0')))) {
            local_68 = (char *)0x0;
            sStack_60 = 0;
            local_58 = 0;
            if ((*(char *)((long)&a_00->bidders[4].data + 1) != '\0') &&
               (archive_strncat((archive_string *)&stack0xffffffffffffff98,
                                (void *)((long)&a_00->bidders[4].data + 1),0x9b),
               local_68[sStack_60 - 1] != '/')) {
              archive_strappend_char((archive_string *)&stack0xffffffffffffff98,'/');
            }
            archive_strncat((archive_string *)&stack0xffffffffffffff98,a_00,100);
            wVar6 = _archive_entry_copy_pathname_l(entry,local_68,sStack_60,tar->sconv);
            if (wVar6 == L'\0') {
              wVar7 = L'\0';
            }
            else {
              wVar7 = set_conversion_failed_error(a,tar->sconv,"Pathname");
              wVar6 = L'\xffffffe2';
              if (wVar7 == L'\xffffffe2') goto LAB_001360bc;
            }
            archive_string_free((archive_string *)&stack0xffffffffffffff98);
          }
          else {
            wVar7 = L'\0';
          }
          wVar8 = header_common(a,tar,entry,a_00);
          wVar6 = L'\xffffffe2';
          if (wVar8 != L'\xffffffe2') {
            if (wVar8 < wVar7) {
              wVar7 = wVar8;
            }
            pcVar11 = archive_entry_uname(entry);
            if (((((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) ||
                 (wVar8 = _archive_entry_copy_uname_l
                                    (entry,(char *)((long)&a_00->bidders[0].vtable + 1),0x20,
                                     tar->sconv), wVar8 == L'\0')) ||
                (wVar7 = set_conversion_failed_error(a,tar->sconv,"Uname"), wVar7 != L'\xffffffe2'))
               && (((pcVar11 = archive_entry_gname(entry), pcVar11 != (char *)0x0 &&
                    (*pcVar11 != '\0')) ||
                   ((wVar8 = _archive_entry_copy_gname_l
                                       (entry,(char *)((long)&a_00->bidders[2].data + 1),0x20,
                                        tar->sconv), wVar8 == L'\0' ||
                    (wVar7 = set_conversion_failed_error(a,tar->sconv,"Gname"),
                    wVar7 != L'\xffffffe2')))))) {
              wVar6 = wVar7;
              if ((byte)(a_00->field_0x9c - 0x33) < 2) {
                wVar7 = archive_entry_rdev_is_set(entry);
                if (wVar7 == L'\0') {
                  dVar14 = tar_atol((char *)((long)&a_00->bidders[3].name + 1),8);
                  archive_entry_set_rdevmajor(entry,dVar14);
                  dVar14 = tar_atol((char *)((long)&a_00->bidders[3].vtable + 1),8);
                  archive_entry_set_rdevminor(entry,dVar14);
                }
              }
              else {
                archive_entry_set_rdev(entry,0);
              }
              goto LAB_00135d0d;
            }
          }
        }
        else {
          (a->archive).archive_format = 0x30000;
          (a->archive).archive_format_name = "tar (non-POSIX)";
          pcVar11 = archive_entry_pathname(entry);
          pwVar17 = archive_entry_pathname_w(entry);
          if (((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) &&
             (((pwVar17 == (wchar_t *)0x0 || (*pwVar17 == L'\0')) &&
              (wVar6 = _archive_entry_copy_pathname_l(entry,(char *)a_00,100,tar->sconv),
              wVar6 != L'\0')))) {
            wVar7 = set_conversion_failed_error(a,tar->sconv,"Pathname");
            if (wVar7 == L'\xffffffe2') goto LAB_00135ce4;
          }
          else {
            wVar7 = L'\0';
          }
          wVar6 = header_common(a,tar,entry,a_00);
          if (wVar7 < wVar6) {
            wVar6 = wVar7;
          }
LAB_00135d0d:
          tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
        }
LAB_001360bc:
        lVar26 = 0x200;
      }
      if (wVar10 < wVar6) {
        wVar6 = wVar10;
      }
      if (wVar6 < L'\xffffffec') goto LAB_0013666c;
      if ((tar->process_mac_extensions == 0) || ((local_84 & 0x200) != 0)) {
LAB_001365e1:
        if (tar->sparse_gnu_attributes_seen == '\0') goto LAB_00136676;
        if ((tar->filetype == '0') || (tar->filetype == 'S')) {
          if (tar->sparse_gnu_major == 1) {
            if (tar->sparse_gnu_minor == 0) {
              sVar19 = gnu_sparse_10_read(a,tar,&local_70);
              if (sVar19 < 0) {
                wVar6 = (wchar_t)sVar19;
              }
              else {
                tar->entry_bytes_remaining = tar->entry_bytes_remaining - sVar19;
              }
              goto LAB_00136676;
            }
          }
          else if ((tar->sparse_gnu_major == 0) && ((uint)tar->sparse_gnu_minor < 2))
          goto LAB_00136676;
          pcVar11 = "Unrecognized GNU sparse file format";
        }
        else {
          pcVar11 = "Non-regular file cannot be sparse";
        }
        archive_set_error(&a->archive,-1,pcVar11);
        wVar6 = L'\xffffffec';
        goto LAB_00136676;
      }
      pwVar17 = archive_entry_pathname_w(entry);
      pwVar20 = pwVar17;
      if (pwVar17 == (wchar_t *)0x0) {
        pcVar11 = archive_entry_pathname(entry);
        pcVar23 = pcVar11;
        if (pcVar11 != (char *)0x0) {
          do {
            while( true ) {
              pcVar22 = pcVar23 + 1;
              cVar2 = *pcVar23;
              pcVar23 = pcVar22;
              if (cVar2 != '/') break;
              if (*pcVar22 != '\0') {
                pcVar11 = pcVar22;
              }
            }
          } while (cVar2 != '\0');
          if (((*pcVar11 != '.') || (pcVar11[1] != '_')) || (pcVar11[2] == '\0')) goto LAB_001365e1;
        }
      }
      else {
        do {
          while( true ) {
            pwVar21 = pwVar20 + 1;
            wVar10 = *pwVar20;
            pwVar20 = pwVar21;
            if (wVar10 != L'/') break;
            if (*pwVar21 != L'\0') {
              pwVar17 = pwVar21;
            }
          }
        } while (wVar10 != L'\0');
        if (((*pwVar17 != L'.') || (pwVar17[1] != L'_')) || (pwVar17[2] == L'\0'))
        goto LAB_001365e1;
      }
      uVar13 = archive_entry_size(entry);
      if ((long)uVar13 < 0) {
LAB_00136541:
        wVar6 = L'\xffffffe2';
        goto LAB_00136688;
      }
      if (0x1000000 < uVar13) {
        archive_set_error(&a->archive,-1,"Oversized AppleDouble extension has size %llu > %llu",
                          uVar13,0x1000000);
        goto LAB_0013666c;
      }
      if (lVar26 != 0) {
        __archive_read_consume(a,lVar26);
      }
      pvVar27 = __archive_read_ahead(a,uVar13,(ssize_t *)0x0);
      if (pvVar27 == (void *)0x0) {
        pcVar11 = "Truncated archive detected while reading macOS metadata";
        iVar25 = 0x16;
LAB_0013653a:
        archive_set_error(&a->archive,iVar25,pcVar11);
        goto LAB_00136541;
      }
      archive_entry_clear(entry);
      archive_entry_copy_mac_metadata(entry,pvVar27,uVar13);
      local_70 = (size_t)((int)uVar13 + 0x1ffU & 0x3fffe00);
      wVar10 = wVar6 >> 0x1f & wVar6;
      local_84 = 0x200;
      bVar4 = false;
      bVar3 = false;
      wVar6 = L'\0';
    }
  }
  else if (bVar1 == 0x67) {
    if (bVar4) goto LAB_0013666c;
    bVar4 = true;
    (a->archive).archive_format = 0x30002;
    (a->archive).archive_format_name = "POSIX pax interchange format";
    lVar26 = tar_atol((char *)((long)&(a_00->archive).read_data_remaining + 4),0xc);
    wVar6 = L'\xffffffe2';
    if (lVar26 < 0x1000000000000000) {
LAB_00135b5b:
      local_70 = (lVar26 + 0x1ffU & 0xfffffffffffffe00) + 0x200;
      wVar6 = L'\0';
    }
  }
  else {
    if (bVar1 != 0x78) goto LAB_00135a0a;
    if ((local_84 & 0x20) != 0) goto LAB_0013666c;
    (a->archive).archive_format = 0x30002;
    pcVar11 = "POSIX pax interchange format";
LAB_001358df:
    local_84 = local_84 | 0x20;
    (a->archive).archive_format_name = pcVar11;
    in_R8 = &local_70;
    wVar6 = header_pax_extension(a,tar,entry,a_00,in_R8);
  }
  if (wVar10 < wVar6) {
    wVar6 = wVar10;
  }
  wVar10 = wVar6;
  if (wVar10 != L'\xffffffe2') {
    uVar13 = local_70;
    if (local_84 != 0) {
      local_44 = 1;
    }
    goto LAB_00135737;
  }
LAB_0013666c:
  wVar6 = L'\xffffffe2';
  goto LAB_00136676;
  while (pcVar23 = pcVar11 + lVar26, lVar26 = lVar26 + 1, *pcVar23 == '\0') {
LAB_001365c3:
    if ((int)lVar26 == 0x200) {
      __archive_read_consume(a,0x200);
      break;
    }
  }
LAB_0013663e:
  archive_clear_error(&a->archive);
  wVar6 = L'\x01';
LAB_00136676:
  if (local_70 != 0) {
    __archive_read_consume(a,local_70);
  }
LAB_00136688:
  psVar24 = tar->sparse_list;
  if (psVar24 == (sparse_block *)0x0) {
    wVar10 = gnu_add_sparse_entry(a,tar,0,tar->entry_bytes_remaining);
    if (wVar10 != L'\0') {
      return L'\xffffffe2';
    }
  }
  else {
    do {
      if (psVar24->hole == 0) {
        archive_entry_sparse_add_entry(entry,psVar24->offset,psVar24->remaining);
      }
      psVar24 = psVar24->next;
    } while (psVar24 != (sparse_block *)0x0);
  }
  if (wVar6 == L'\0') {
    mVar9 = archive_entry_filetype(entry);
    wVar6 = L'\0';
    if (mVar9 == 0x8000) {
      pwVar17 = archive_entry_pathname_w(entry);
      if (pwVar17 == (wchar_t *)0x0) {
        pcVar11 = archive_entry_pathname(entry);
        if (pcVar11 == (char *)0x0) {
          return L'\0';
        }
        sVar18 = strlen(pcVar11);
        if (sVar18 == 0) {
          return L'\0';
        }
        if (pcVar11[sVar18 - 1] != '/') {
          return L'\0';
        }
      }
      else {
        sVar18 = wcslen(pwVar17);
        if (sVar18 == 0) {
          return L'\0';
        }
        if (pwVar17[sVar18 - 1] != L'/') {
          return L'\0';
        }
      }
      archive_entry_set_filetype(entry,0x4000);
      wVar6 = L'\0';
      tar->entry_bytes_remaining = 0;
      tar->entry_padding = 0;
    }
  }
  return wVar6;
}

Assistant:

static int
tar_read_header(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, size_t *unconsumed)
{
	ssize_t bytes;
	int err = ARCHIVE_OK, err2;
	int eof_fatal = 0; /* EOF is okay at some points... */
	const char *h;
	const struct archive_entry_header_ustar *header;
	const struct archive_entry_header_gnutar *gnuheader;

	/* Bitmask of what header types we've seen. */
	int32_t seen_headers = 0;
	static const int32_t seen_A_header = 1;
	static const int32_t seen_g_header = 2;
	static const int32_t seen_K_header = 4;
	static const int32_t seen_L_header = 8;
	static const int32_t seen_V_header = 16;
	static const int32_t seen_x_header = 32; /* Also X */
	static const int32_t seen_mac_metadata = 512;

	tar->pax_hdrcharset_utf8 = 1;
	tar->sparse_gnu_attributes_seen = 0;
	archive_string_empty(&(tar->entry_gname));
	archive_string_empty(&(tar->entry_pathname));
	archive_string_empty(&(tar->entry_pathname_override));
	archive_string_empty(&(tar->entry_uname));
	archive_string_empty(&tar->entry_linkpath);

	/* Ensure format is set. */
	if (a->archive.archive_format_name == NULL) {
		a->archive.archive_format = ARCHIVE_FORMAT_TAR;
		a->archive.archive_format_name = "tar";
	}

	/*
	 * TODO: Write global/default pax options into
	 * 'entry' struct here before overwriting with
	 * file-specific options.
	 */

	/* Loop over all the headers needed for the next entry */
	for (;;) {

		/* Find the next valid header record. */
		while (1) {
			tar_flush_unconsumed(a, unconsumed);

			/* Read 512-byte header record */
			h = __archive_read_ahead(a, 512, &bytes);
			if (bytes == 0) { /* EOF at a block boundary. */
				if (eof_fatal) {
					/* We've read a special header already;
					 * if there's no regular header, then this is
					 * a premature EOF. */
					archive_set_error(&a->archive, EINVAL,
							  "Damaged tar archive (end-of-archive within a sequence of headers)");
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_EOF);
				}
			}
			if (h == NULL) {  /* Short block at EOF; this is bad. */
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Truncated tar archive"
				    " detected while reading next header");
				return (ARCHIVE_FATAL);
			}
			*unconsumed += 512;

			if (h[0] == 0 && archive_block_is_null(h)) {
				/* We found a NULL block which indicates end-of-archive */

				if (tar->read_concatenated_archives) {
					/* We're ignoring NULL blocks, so keep going. */
					continue;
				}

				/* Try to consume a second all-null record, as well. */
				/* If we can't, that's okay. */
				tar_flush_unconsumed(a, unconsumed);
				h = __archive_read_ahead(a, 512, NULL);
				if (h != NULL && h[0] == 0 && archive_block_is_null(h))
						__archive_read_consume(a, 512);

				archive_clear_error(&a->archive);
				return (ARCHIVE_EOF);
			}

			/* This is NOT a null block, so it must be a valid header. */
			if (!checksum(a, h)) {
				tar_flush_unconsumed(a, unconsumed);
				archive_set_error(&a->archive, EINVAL,
						  "Damaged tar archive (bad header checksum)");
				/* If we've read some critical information (pax headers, etc)
				 * and _then_ see a bad header, we can't really recover. */
				if (eof_fatal) {
					return (ARCHIVE_FATAL);
				} else {
					return (ARCHIVE_RETRY);
				}
			}
			break;
		}

		/* Determine the format variant. */
		header = (const struct archive_entry_header_ustar *)h;
		switch(header->typeflag[0]) {
		case 'A': /* Solaris tar ACL */
			if (seen_headers & seen_A_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_A_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "Solaris tar";
			err2 = header_Solaris_ACL(a, tar, entry, h, unconsumed);
			break;
		case 'g': /* POSIX-standard 'g' header. */
			if (seen_headers & seen_g_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_g_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_global(a, tar, entry, h, unconsumed);
			break;
		case 'K': /* Long link name (GNU tar, others) */
			if (seen_headers & seen_K_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_K_header;
			err2 = header_gnu_longlink(a, tar, entry, h, unconsumed);
			break;
		case 'L': /* Long filename (GNU tar, others) */
			if (seen_headers & seen_L_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_L_header;
			err2 = header_gnu_longname(a, tar, entry, h, unconsumed);
			break;
		case 'V': /* GNU volume header */
			if (seen_headers & seen_V_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_V_header;
			err2 = header_volume(a, tar, entry, h, unconsumed);
			break;
		case 'X': /* Used by SUN tar; same as 'x'. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name =
				"POSIX pax interchange format (Sun variant)";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		case 'x': /* POSIX-standard 'x' header. */
			if (seen_headers & seen_x_header) {
				return (ARCHIVE_FATAL);
			}
			seen_headers |= seen_x_header;
			a->archive.archive_format = ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE;
			a->archive.archive_format_name = "POSIX pax interchange format";
			err2 = header_pax_extension(a, tar, entry, h, unconsumed);
			break;
		default: /* Regular header: Legacy tar, GNU tar, or ustar */
			gnuheader = (const struct archive_entry_header_gnutar *)h;
			if (memcmp(gnuheader->magic, "ustar  \0", 8) == 0) {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR_GNUTAR;
				a->archive.archive_format_name = "GNU tar format";
				err2 = header_gnutar(a, tar, entry, h, unconsumed);
			} else if (memcmp(header->magic, "ustar", 5) == 0) {
				if (a->archive.archive_format != ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
					a->archive.archive_format = ARCHIVE_FORMAT_TAR_USTAR;
					a->archive.archive_format_name = "POSIX ustar format";
				}
				err2 = header_ustar(a, tar, entry, h);
			} else {
				a->archive.archive_format = ARCHIVE_FORMAT_TAR;
				a->archive.archive_format_name = "tar (non-POSIX)";
				err2 = header_old_tar(a, tar, entry, h);
			}
			err = err_combine(err, err2);
			/* We return warnings or success as-is.  Anything else is fatal. */
			if (err < ARCHIVE_WARN) {
				return (ARCHIVE_FATAL);
			}
			/* Filename of the form `._filename` is an AppleDouble
			 * extension entry.  The body is the macOS metadata blob;
			 * this is followed by another entry with the actual
			 * regular file data.
			 * This design has two drawbacks:
			 * = it's brittle; you might just have a file with such a name
			 * = it duplicates any long pathname extensions
			 *
			 * TODO: This probably shouldn't be here at all.  Consider
			 * just returning the contents as a regular entry here and
			 * then dealing with it when we write data to disk.
			 */
			if (tar->process_mac_extensions
			    && ((seen_headers & seen_mac_metadata) == 0)
			    && is_mac_metadata_entry(entry)) {
				err2 = read_mac_metadata_blob(a, entry, unconsumed);
				if (err2 < ARCHIVE_WARN) {
					return (ARCHIVE_FATAL);
				}
				err = err_combine(err, err2);
				/* Note: Other headers can appear again. */
				seen_headers = seen_mac_metadata;
				break;
			}

			/* Reconcile GNU sparse attributes */
			if (tar->sparse_gnu_attributes_seen) {
				/* Only 'S' (GNU sparse) and ustar '0' regular files can be sparse */
				if (tar->filetype != 'S' && tar->filetype != '0') {
					archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
							  "Non-regular file cannot be sparse");
					return (ARCHIVE_WARN);
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 0 &&
				    tar->sparse_gnu_minor == 1) {
					/* Sparse map already parsed from 'x' header */
				} else if (tar->sparse_gnu_major == 1 &&
				    tar->sparse_gnu_minor == 0) {
					/* Sparse map is prepended to file contents */
					ssize_t bytes_read;
					bytes_read = gnu_sparse_10_read(a, tar, unconsumed);
					if (bytes_read < 0)
						return ((int)bytes_read);
					tar->entry_bytes_remaining -= bytes_read;
				} else {
					archive_set_error(&a->archive,
							  ARCHIVE_ERRNO_MISC,
							  "Unrecognized GNU sparse file format");
					return (ARCHIVE_WARN);
				}
			}
			return (err);
		}

		/* We're between headers ... */
		err = err_combine(err, err2);
		if (err == ARCHIVE_FATAL)
			return (err);

		/* The GNU volume header and the pax `g` global header
		 * are both allowed to be the only header in an
		 * archive.  If we've seen any other header, a
		 * following EOF is fatal. */
		if ((seen_headers & ~seen_V_header & ~seen_g_header) != 0) {
			eof_fatal = 1;
		}
	}
}